

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

vector<ipv4_address,_std::allocator<ipv4_address>_> *
ipv4_address::resolve
          (vector<ipv4_address,_std::allocator<ipv4_address>_> *__return_storage_ptr__,
          string *hostname)

{
  addrinfo *paVar1;
  uint __line;
  int __ecode;
  ostream *poVar2;
  runtime_error *this;
  char *pcVar3;
  addrinfo **__pai;
  addrinfo *list_head;
  string local_1f8 [32];
  addrinfo hints;
  stringstream ss;
  ostream local_198 [376];
  
  hints.ai_flags = 0;
  hints.ai_protocol = 0;
  hints.ai_canonname = (char *)0x0;
  hints.ai_next = (addrinfo *)0x0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_family = 2;
  hints.ai_socktype = 1;
  __pai = (addrinfo **)&list_head;
  __ecode = getaddrinfo((hostname->_M_dataplus)._M_p,(char *)0x0,(addrinfo *)&hints,__pai);
  if (__ecode != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<(local_198,"can not resolve server \'");
    poVar2 = std::operator<<(poVar2,(string *)hostname);
    poVar2 = std::operator<<(poVar2,"\': ");
    pcVar3 = gai_strerror(__ecode);
    std::operator<<(poVar2,pcVar3);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this,local_1f8);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (__return_storage_ptr__->super__Vector_base<ipv4_address,_std::allocator<ipv4_address>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ipv4_address,_std::allocator<ipv4_address>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ipv4_address,_std::allocator<ipv4_address>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    paVar1 = *__pai;
    if (paVar1 == (addrinfo *)0x0) {
      freeaddrinfo((addrinfo *)list_head);
      return __return_storage_ptr__;
    }
    if (paVar1->ai_family != 2) break;
    if (paVar1->ai_socktype != 1) {
      pcVar3 = "i->ai_socktype == SOCK_STREAM";
      __line = 0x43;
      goto LAB_0010d02b;
    }
    _ss = *(undefined4 *)(paVar1->ai_addr->sa_data + 2);
    std::vector<ipv4_address,_std::allocator<ipv4_address>_>::emplace_back<ipv4_address>
              (__return_storage_ptr__,(ipv4_address *)&ss);
    __pai = &paVar1->ai_next;
  }
  pcVar3 = "i->ai_family == AF_INET";
  __line = 0x42;
LAB_0010d02b:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/address.cpp"
                ,__line,
                "static std::vector<ipv4_address> ipv4_address::resolve(const std::string &)");
}

Assistant:

std::vector<ipv4_address> ipv4_address::resolve(std::string const& hostname)
{
    addrinfo hints{};
    hints.ai_family = AF_INET;
    hints.ai_socktype = SOCK_STREAM;

    addrinfo* list_head;
    int res = getaddrinfo(hostname.c_str(), nullptr, &hints, &list_head);
    if (res != 0)
    {
        std::stringstream ss;
        ss << "can not resolve server '" << hostname << "': " << gai_strerror(res);
        throw std::runtime_error(ss.str());
    }

    std::vector<ipv4_address> r;

    for (addrinfo* i = list_head; i != nullptr; i = i->ai_next)
    {
        assert(i->ai_family == AF_INET);
        assert(i->ai_socktype == SOCK_STREAM);
        r.push_back(ipv4_address{reinterpret_cast<sockaddr_in const*>(i->ai_addr)->sin_addr.s_addr});
    }

    // TODO: move to destructor
    freeaddrinfo(list_head);

    return r;
}